

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void bestVirtualIndex(WhereBestIdx *p)

{
  u16 uVar1;
  undefined4 uVar2;
  Parse *pParse_00;
  WhereClause *pWVar3;
  Table *pTab_00;
  void *__s;
  WhereTerm *pWVar4;
  int iVar5;
  double dVar6;
  double local_68;
  double rCost;
  int bAllowIN;
  int nOrderBy;
  int j;
  int i;
  WhereTerm *pTerm;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_constraint *pIdxCons;
  sqlite3_index_info *pIdxInfo;
  Table *pTab;
  SrcList_item *pSrc;
  WhereClause *pWC;
  Parse *pParse;
  WhereBestIdx *p_local;
  
  pParse_00 = p->pParse;
  pWVar3 = p->pWC;
  pTab_00 = p->pSrc->pTab;
  memset(&p->cost,0,0x28);
  (p->cost).plan.wsFlags = 0x8000000;
  pIdxCons = (sqlite3_index_constraint *)*p->ppIdxInfo;
  if ((sqlite3_index_info *)pIdxCons == (sqlite3_index_info *)0x0) {
    pIdxCons = (sqlite3_index_constraint *)allocateIndexInfo(p);
    *p->ppIdxInfo = (sqlite3_index_info *)pIdxCons;
  }
  if (pIdxCons == (sqlite3_index_constraint *)0x0) {
    return;
  }
  rCost._0_4_ = 1;
  do {
    pUsage = *(sqlite3_index_constraint_usage **)&pIdxCons->iTermOffset;
    __s = *(void **)&pIdxCons[2].iTermOffset;
    for (nOrderBy = 0; nOrderBy < pIdxCons->iColumn; nOrderBy = nOrderBy + 1) {
      pWVar4 = pWVar3->a;
      if (((pWVar4[pUsage[1].argvIndex].prereqRight & p->notReady) == 0) &&
         ((rCost._0_4_ != 0 || ((pWVar4[pUsage[1].argvIndex].eOperator & 1) == 0)))) {
        pUsage->field_0x5 = 1;
      }
      else {
        pUsage->field_0x5 = 0;
      }
      pUsage = (sqlite3_index_constraint_usage *)&pUsage[1].omit;
    }
    memset(__s,0,(long)pIdxCons->iColumn << 3);
    if (pIdxCons[4].iTermOffset != 0) {
      sqlite3_free(*(void **)(pIdxCons + 4));
    }
    pIdxCons[4].iColumn = 0;
    pIdxCons[4].op = '\0';
    pIdxCons[4].usable = '\0';
    *(undefined2 *)&pIdxCons[4].field_0x6 = 0;
    pIdxCons[3].op = '\0';
    pIdxCons[3].usable = '\0';
    *(undefined2 *)&pIdxCons[3].field_0x6 = 0;
    pIdxCons[4].iTermOffset = 0;
    pIdxCons[5].iColumn = 0;
    pIdxCons[5].op = '.';
    pIdxCons[5].usable = 0x9f;
    *(undefined2 *)&pIdxCons[5].field_0x6 = 0xa287;
    pIdxCons[5].iTermOffset = 0x546d42ae;
    uVar2._0_1_ = pIdxCons[1].op;
    uVar2._1_1_ = pIdxCons[1].usable;
    uVar2._2_2_ = *(undefined2 *)&pIdxCons[1].field_0x6;
    if (p->pOrderBy == (ExprList *)0x0) {
      pIdxCons[1].op = '\0';
      pIdxCons[1].usable = '\0';
      *(undefined2 *)&pIdxCons[1].field_0x6 = 0;
    }
    iVar5 = vtabBestIndex(pParse_00,pTab_00,(sqlite3_index_info *)pIdxCons);
    if (iVar5 != 0) {
      return;
    }
    pUsage = *(sqlite3_index_constraint_usage **)&pIdxCons->iTermOffset;
    for (nOrderBy = 0; nOrderBy < pIdxCons->iColumn; nOrderBy = nOrderBy + 1) {
      if ((0 < *(int *)((long)__s + (long)nOrderBy * 8)) &&
         (iVar5 = pUsage[1].argvIndex, pWVar4 = pWVar3->a,
         (p->cost).used = pWVar4[iVar5].prereqRight | (p->cost).used,
         (pWVar4[iVar5].eOperator & 1) != 0)) {
        if (*(char *)((long)__s + (long)nOrderBy * 8 + 4) == '\0') break;
        pIdxCons[5].iColumn = 0;
      }
      pUsage = (sqlite3_index_constraint_usage *)&pUsage[1].omit;
    }
    if (pIdxCons->iColumn <= nOrderBy) {
      if (pIdxCons[5].iColumn != 0) {
        for (nOrderBy = 0; nOrderBy < p->i; nOrderBy = nOrderBy + 1) {
          if ((p->aLevel[nOrderBy].plan.wsFlags & 0x2000000) == 0) {
            pIdxCons[5].iColumn = 0;
          }
        }
      }
      local_68 = *(double *)&pIdxCons[5].op;
      if ((p->pOrderBy != (ExprList *)0x0) && (pIdxCons[5].iColumn == 0)) {
        dVar6 = estLog(local_68);
        local_68 = dVar6 * local_68 + local_68;
      }
      if (local_68 <= 5e+98) {
        (p->cost).rCost = local_68;
      }
      else {
        (p->cost).rCost = 5e+98;
      }
      (p->cost).plan.u.pIdx = (Index *)pIdxCons;
      if (pIdxCons[5].iColumn == 0) {
        if (p->i == 0) {
          uVar1 = 0;
        }
        else {
          uVar1 = p->aLevel[p->i + -1].plan.nOBSat;
        }
        (p->cost).plan.nOBSat = uVar1;
      }
      else {
        (p->cost).plan.wsFlags = (p->cost).plan.wsFlags | 0x800000;
        (p->cost).plan.nOBSat = (u16)uVar2;
      }
      (p->cost).plan.nEq = 0;
      pIdxCons[1].op = (undefined1)uVar2;
      pIdxCons[1].usable = uVar2._1_1_;
      *(undefined2 *)&pIdxCons[1].field_0x6 = uVar2._2_2_;
      bestOrClauseIndex(p);
      return;
    }
    rCost._0_4_ = rCost._0_4_ + -1;
  } while( true );
}

Assistant:

static void bestVirtualIndex(WhereBestIdx *p){
  Parse *pParse = p->pParse;      /* The parsing context */
  WhereClause *pWC = p->pWC;      /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc; /* The FROM clause term to search */
  Table *pTab = pSrc->pTab;
  sqlite3_index_info *pIdxInfo;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage;
  WhereTerm *pTerm;
  int i, j;
  int nOrderBy;
  int bAllowIN;                   /* Allow IN optimizations */
  double rCost;

  /* Make sure wsFlags is initialized to some sane value. Otherwise, if the 
  ** malloc in allocateIndexInfo() fails and this function returns leaving
  ** wsFlags in an uninitialized state, the caller may behave unpredictably.
  */
  memset(&p->cost, 0, sizeof(p->cost));
  p->cost.plan.wsFlags = WHERE_VIRTUALTABLE;

  /* If the sqlite3_index_info structure has not been previously
  ** allocated and initialized, then allocate and initialize it now.
  */
  pIdxInfo = *p->ppIdxInfo;
  if( pIdxInfo==0 ){
    *p->ppIdxInfo = pIdxInfo = allocateIndexInfo(p);
  }
  if( pIdxInfo==0 ){
    return;
  }

  /* At this point, the sqlite3_index_info structure that pIdxInfo points
  ** to will have been initialized, either during the current invocation or
  ** during some prior invocation.  Now we just have to customize the
  ** details of pIdxInfo for the current invocation and pass it to
  ** xBestIndex.
  */

  /* The module name must be defined. Also, by this point there must
  ** be a pointer to an sqlite3_vtab structure. Otherwise
  ** sqlite3ViewGetColumnNames() would have picked up the error. 
  */
  assert( pTab->azModuleArg && pTab->azModuleArg[0] );
  assert( sqlite3GetVTable(pParse->db, pTab) );

  /* Try once or twice.  On the first attempt, allow IN optimizations.
  ** If an IN optimization is accepted by the virtual table xBestIndex
  ** method, but the  pInfo->aConstrainUsage.omit flag is not set, then
  ** the query will not work because it might allow duplicate rows in
  ** output.  In that case, run the xBestIndex method a second time
  ** without the IN constraints.  Usually this loop only runs once.
  ** The loop will exit using a "break" statement.
  */
  for(bAllowIN=1; 1; bAllowIN--){
    assert( bAllowIN==0 || bAllowIN==1 );

    /* Set the aConstraint[].usable fields and initialize all 
    ** output variables to zero.
    **
    ** aConstraint[].usable is true for constraints where the right-hand
    ** side contains only references to tables to the left of the current
    ** table.  In other words, if the constraint is of the form:
    **
    **           column = expr
    **
    ** and we are evaluating a join, then the constraint on column is 
    ** only valid if all tables referenced in expr occur to the left
    ** of the table containing column.
    **
    ** The aConstraints[] array contains entries for all constraints
    ** on the current table.  That way we only have to compute it once
    ** even though we might try to pick the best index multiple times.
    ** For each attempt at picking an index, the order of tables in the
    ** join might be different so we have to recompute the usable flag
    ** each time.
    */
    pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
    pUsage = pIdxInfo->aConstraintUsage;
    for(i=0; i<pIdxInfo->nConstraint; i++, pIdxCons++){
      j = pIdxCons->iTermOffset;
      pTerm = &pWC->a[j];
      if( (pTerm->prereqRight&p->notReady)==0
       && (bAllowIN || (pTerm->eOperator & WO_IN)==0)
      ){
        pIdxCons->usable = 1;
      }else{
        pIdxCons->usable = 0;
      }
    }
    memset(pUsage, 0, sizeof(pUsage[0])*pIdxInfo->nConstraint);
    if( pIdxInfo->needToFreeIdxStr ){
      sqlite3_free(pIdxInfo->idxStr);
    }
    pIdxInfo->idxStr = 0;
    pIdxInfo->idxNum = 0;
    pIdxInfo->needToFreeIdxStr = 0;
    pIdxInfo->orderByConsumed = 0;
    /* ((double)2) In case of SQLITE_OMIT_FLOATING_POINT... */
    pIdxInfo->estimatedCost = SQLITE_BIG_DBL / ((double)2);
    nOrderBy = pIdxInfo->nOrderBy;
    if( !p->pOrderBy ){
      pIdxInfo->nOrderBy = 0;
    }
  
    if( vtabBestIndex(pParse, pTab, pIdxInfo) ){
      return;
    }
  
    pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
    for(i=0; i<pIdxInfo->nConstraint; i++, pIdxCons++){
      if( pUsage[i].argvIndex>0 ){
        j = pIdxCons->iTermOffset;
        pTerm = &pWC->a[j];
        p->cost.used |= pTerm->prereqRight;
        if( (pTerm->eOperator & WO_IN)!=0 ){
          if( pUsage[i].omit==0 ){
            /* Do not attempt to use an IN constraint if the virtual table
            ** says that the equivalent EQ constraint cannot be safely omitted.
            ** If we do attempt to use such a constraint, some rows might be
            ** repeated in the output. */
            break;
          }
          /* A virtual table that is constrained by an IN clause may not
          ** consume the ORDER BY clause because (1) the order of IN terms
          ** is not necessarily related to the order of output terms and
          ** (2) Multiple outputs from a single IN value will not merge
          ** together.  */
          pIdxInfo->orderByConsumed = 0;
        }
      }
    }
    if( i>=pIdxInfo->nConstraint ) break;
  }

  /* The orderByConsumed signal is only valid if all outer loops collectively
  ** generate just a single row of output.
  */
  if( pIdxInfo->orderByConsumed ){
    for(i=0; i<p->i; i++){
      if( (p->aLevel[i].plan.wsFlags & WHERE_UNIQUE)==0 ){
        pIdxInfo->orderByConsumed = 0;
      }
    }
  }
  
  /* If there is an ORDER BY clause, and the selected virtual table index
  ** does not satisfy it, increase the cost of the scan accordingly. This
  ** matches the processing for non-virtual tables in bestBtreeIndex().
  */
  rCost = pIdxInfo->estimatedCost;
  if( p->pOrderBy && pIdxInfo->orderByConsumed==0 ){
    rCost += estLog(rCost)*rCost;
  }

  /* The cost is not allowed to be larger than SQLITE_BIG_DBL (the
  ** inital value of lowestCost in this loop. If it is, then the
  ** (cost<lowestCost) test below will never be true.
  ** 
  ** Use "(double)2" instead of "2.0" in case OMIT_FLOATING_POINT 
  ** is defined.
  */
  if( (SQLITE_BIG_DBL/((double)2))<rCost ){
    p->cost.rCost = (SQLITE_BIG_DBL/((double)2));
  }else{
    p->cost.rCost = rCost;
  }
  p->cost.plan.u.pVtabIdx = pIdxInfo;
  if( pIdxInfo->orderByConsumed ){
    p->cost.plan.wsFlags |= WHERE_ORDERED;
    p->cost.plan.nOBSat = nOrderBy;
  }else{
    p->cost.plan.nOBSat = p->i ? p->aLevel[p->i-1].plan.nOBSat : 0;
  }
  p->cost.plan.nEq = 0;
  pIdxInfo->nOrderBy = nOrderBy;

  /* Try to find a more efficient access pattern by using multiple indexes
  ** to optimize an OR expression within the WHERE clause. 
  */
  bestOrClauseIndex(p);
}